

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::strings::Utf8SafeCEscape(string *__return_storage_ptr__,string *src)

{
  int iVar1;
  char *pcVar2;
  pointer pcVar3;
  LogMessage *other;
  ulong uVar4;
  allocator local_7b;
  LogFinisher local_7a;
  byte local_79;
  LogMessage local_78;
  int local_2c;
  int len;
  unique_ptr<char[],_std::default_delete<char[]>_> dest;
  int dest_length;
  string *src_local;
  
  iVar1 = std::__cxx11::string::size();
  dest._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl._4_4_ = iVar1 * 4 + 1;
  uVar4 = (ulong)dest._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_;
  if ((long)uVar4 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pcVar2 = (char *)operator_new__(uVar4);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&stack0xffffffffffffffd8,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::data();
  iVar1 = std::__cxx11::string::size();
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)&stack0xffffffffffffffd8);
  local_2c = CEscapeInternal(pcVar2,iVar1,pcVar3,
                             dest._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                             _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_,false,true);
  local_79 = 0;
  if (local_2c < 0) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x260);
    local_79 = 1;
    other = internal::LogMessage::operator<<(&local_78,"CHECK failed: (len) >= (0): ");
    internal::LogFinisher::operator=(&local_7a,other);
  }
  if ((local_79 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_78);
  }
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)&stack0xffffffffffffffd8);
  uVar4 = (ulong)local_2c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,uVar4,&local_7b);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

std::string Utf8SafeCEscape(const std::string &src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  std::unique_ptr<char[]> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, false, true);
  GOOGLE_DCHECK_GE(len, 0);
  return std::string(dest.get(), len);
}